

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O0

bool testing::internal::ParseGoogleMockBoolFlag(char *str,char *flag,bool *value)

{
  char *pcVar1;
  undefined1 local_31;
  char *value_str;
  bool *value_local;
  char *flag_local;
  char *str_local;
  
  pcVar1 = ParseGoogleMockFlagValue(str,flag,true);
  if (pcVar1 == (char *)0x0) {
    str_local._7_1_ = false;
  }
  else {
    local_31 = true;
    if ((*pcVar1 != '0') && (local_31 = true, *pcVar1 != 'f')) {
      local_31 = *pcVar1 == 'F';
    }
    *value = (bool)((local_31 ^ 0xffU) & 1);
    str_local._7_1_ = true;
  }
  return str_local._7_1_;
}

Assistant:

static bool ParseGoogleMockBoolFlag(const char* str, const char* flag,
                                    bool* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseGoogleMockFlagValue(str, flag, true);

  // Aborts if the parsing failed.
  if (value_str == NULL) return false;

  // Converts the string value to a bool.
  *value = !(*value_str == '0' || *value_str == 'f' || *value_str == 'F');
  return true;
}